

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileStream.cpp
# Opt level: O2

bool FileStream_Replace(TFileStream *pStream,TFileStream *pNewStream)

{
  bool bVar1;
  int iVar2;
  DWORD *pDVar3;
  DWORD dwErrCode;
  
  if ((char)pStream->dwFlags == '\0') {
    if ((pStream->dwFlags >> 8 & 1) == 0) {
      (*pNewStream->BaseClose)(pNewStream);
      (*pStream->BaseClose)(pStream);
      iVar2 = rename(pNewStream->szFileName,pStream->szFileName);
      if (iVar2 != -1) {
        bVar1 = BaseFile_Open(pStream,pStream->szFileName,pStream->dwFlags);
        if (!bVar1) {
          return false;
        }
        FileStream_Close(pNewStream);
        return true;
      }
      pDVar3 = (DWORD *)__errno_location();
      dwErrCode = *pDVar3;
    }
    else {
      dwErrCode = 1;
    }
  }
  else {
    dwErrCode = 0x5f;
  }
  SetLastError(dwErrCode);
  return false;
}

Assistant:

bool FileStream_Replace(TFileStream * pStream, TFileStream * pNewStream)
{
    // Only supported on flat files
    if((pStream->dwFlags & STREAM_PROVIDERS_MASK) != (STREAM_PROVIDER_FLAT | BASE_PROVIDER_FILE))
    {
        SetLastError(ERROR_NOT_SUPPORTED);
        return false;
    }

    // Not supported on read-only streams
    if(pStream->dwFlags & STREAM_FLAG_READ_ONLY)
    {
        SetLastError(ERROR_ACCESS_DENIED);
        return false;
    }

    // Close both stream's base providers
    pNewStream->BaseClose(pNewStream);
    pStream->BaseClose(pStream);

    // Now we have to delete the (now closed) old file and rename the new file
    if(!BaseFile_Replace(pStream, pNewStream))
        return false;

    // Now open the base file again
    if(!BaseFile_Open(pStream, pStream->szFileName, pStream->dwFlags))
        return false;

    // Cleanup the new stream
    FileStream_Close(pNewStream);
    return true;
}